

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::parseImmediate(MipsParser *this,Parser *parser,Expression *dest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  Token *pTVar6;
  MipsParser *this_01;
  MipsRegisterValue tempValue;
  Expression local_68;
  MipsRegisterValue local_50;
  
  this_01 = (MipsParser *)
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].tokenizer;
  p_Var2 = (_List_node_base *)(this_01->registers).grs.name._name.field_2._M_allocated_capacity;
  pTVar6 = Tokenizer::peekToken((Tokenizer *)this_01,0);
  if (pTVar6->type == LParen) {
    this_01 = (MipsParser *)
              (parser->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].tokenizer;
    Tokenizer::eatTokens((Tokenizer *)this_01,1);
  }
  paVar1 = &local_50.name._name.field_2;
  local_50.name._name.field_2._8_8_ = 0;
  local_50.name._name._M_string_length = 0;
  local_50.name._name.field_2._M_allocated_capacity = 0;
  local_50.name._name._M_dataplus._M_p = (pointer)paVar1;
  bVar5 = parseRegister(this_01,parser,&local_50);
  (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var2;
  if (bVar5) {
    bVar5 = false;
  }
  else {
    Parser::parseExpression(&local_68,parser);
    _Var4._M_pi = local_68.expression.
                  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar3 = local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    dest->constExpression = local_68.constExpression;
    if (local_68.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.expression.
                 super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    bVar5 = (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.name._name._M_dataplus._M_p,
                    local_50.name._name.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool MipsParser::parseImmediate(Parser& parser, Expression& dest)
{
	// check for (reg) or reg sequence
	TokenizerPosition pos = parser.getTokenizer()->getPosition();

	bool hasParen = parser.peekToken().type == TokenType::LParen;
	if (hasParen)
		parser.eatToken();

	MipsRegisterValue tempValue;
	bool isRegister = parseRegister(parser,tempValue);
	parser.getTokenizer()->setPosition(pos);

	if (isRegister)
		return false;

	dest = parser.parseExpression();
	return dest.isLoaded();
}